

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall fasttext::Model::computeOutputSoftmax(Model *this,Vector *hidden,Vector *output)

{
  undefined1 auVar1 [16];
  real *prVar2;
  long lVar3;
  real rVar4;
  double dVar5;
  undefined1 auVar6 [64];
  float fVar7;
  
  Vector::mul(output,(this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,hidden);
  prVar2 = Vector::operator[](output,0);
  rVar4 = *prVar2;
  auVar6 = ZEXT464((uint)rVar4);
  if (0 < this->osz_) {
    lVar3 = 0;
    do {
      prVar2 = Vector::operator[](output,lVar3);
      auVar1 = vmaxss_avx(ZEXT416(auVar6._0_4_),ZEXT416((uint)*prVar2));
      auVar6 = ZEXT1664(auVar1);
      rVar4 = auVar1._0_4_;
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->osz_);
  }
  if (this->osz_ < 1) {
    fVar7 = 0.0;
  }
  else {
    fVar7 = 0.0;
    lVar3 = 0;
    do {
      prVar2 = Vector::operator[](output,lVar3);
      dVar5 = exp((double)(*prVar2 - rVar4));
      prVar2 = Vector::operator[](output,lVar3);
      *prVar2 = (float)dVar5;
      prVar2 = Vector::operator[](output,lVar3);
      fVar7 = fVar7 + *prVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->osz_);
  }
  if (0 < this->osz_) {
    lVar3 = 0;
    do {
      prVar2 = Vector::operator[](output,lVar3);
      *prVar2 = *prVar2 / fVar7;
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->osz_);
  }
  return;
}

Assistant:

void Model::computeOutputSoftmax(Vector& hidden, Vector& output) const {
  output.mul(*wo_, hidden);
  real max = output[0], z = 0.0;
  for (int32_t i = 0; i < osz_; i++) {
    max = std::max(output[i], max);
  }
  for (int32_t i = 0; i < osz_; i++) {
    output[i] = exp(output[i] - max);
    z += output[i];
  }
  for (int32_t i = 0; i < osz_; i++) {
    output[i] /= z;
  }
}